

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

Value * soul::Value::fromExternalValue(soul::Type_const&,choc::value::ValueView_const&,soul::
        ConstantTable&,soul::StringDictionary&)::ConversionState::castOrThrow(soul::Type_const&,soul
        ::Value___(Value *__return_storage_ptr__,Type *type,Value *v)

{
  bool bVar1;
  CompileMessage errorMessage;
  CompileMessage local_88;
  CompileMessage local_50;
  
  bVar1 = Type::isIdentical(&v->type,type);
  if (bVar1) {
    Value::Value(__return_storage_ptr__,v);
  }
  else {
    local_88.description._M_dataplus._M_p = (pointer)&local_88.description.field_2;
    local_88.description._M_string_length = 0;
    local_88.description.field_2._M_local_buf[0] = '\0';
    local_88.location.sourceCode.object = (SourceCodeText *)0x0;
    local_88.location.location.data = (char *)0x0;
    local_88.type = error;
    local_88.category = none;
    tryCastToType(__return_storage_ptr__,v,type,&local_88);
    if ((__return_storage_ptr__->type).category == invalid) {
      CompileMessage::CompileMessage(&local_50,&local_88);
      throwError(&local_50);
    }
    CompileMessage::~CompileMessage(&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

static Value castOrThrow (const Type& type, Value&& v)
        {
            if (v.getType().isIdentical (type))
                return std::move (v);

            CompileMessage errorMessage;
            auto result = v.tryCastToType (type, errorMessage);

            if (! result.isValid())
                throwError (errorMessage);

            return result;
        }